

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezePdu.cpp
# Opt level: O2

bool __thiscall DIS::StopFreezePdu::operator==(StopFreezePdu *this,StopFreezePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar2 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  return (((bVar2 && bVar1) && this->_reason == rhs->_reason) &&
         this->_frozenBehavior == rhs->_frozenBehavior) &&
         (this->_requestID == rhs->_requestID && this->_padding1 == rhs->_padding1);
}

Assistant:

bool StopFreezePdu::operator ==(const StopFreezePdu& rhs) const
{
    bool ivarsEqual = true;

    ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

    if (!(_realWorldTime == rhs._realWorldTime))
        ivarsEqual = false;
    if (!(_reason == rhs._reason))
        ivarsEqual = false;
    if (!(_frozenBehavior == rhs._frozenBehavior))
        ivarsEqual = false;
    if (!(_padding1 == rhs._padding1))
        ivarsEqual = false;
    if (!(_requestID == rhs._requestID))
        ivarsEqual = false;

    return ivarsEqual;
}